

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int f_tostring(lua_State *L)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)luaL_checkudata(L,1,"FILE*");
  if (puVar1[1] == 0) {
    lua_pushstring(L,"file (closed)");
  }
  else {
    lua_pushfstring(L,"file (%p)",*puVar1);
  }
  return 1;
}

Assistant:

static int f_tostring (lua_State *L) {
  LStream *p = tolstream(L);
  if (isclosed(p))
    lua_pushliteral(L, "file (closed)");
  else
    lua_pushfstring(L, "file (%p)", p->f);
  return 1;
}